

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

int __thiscall BoardView::EPCCheck(BoardView *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long *plVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  shared_ptr<Point> *p_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar13;
  shared_ptr<Point> *p_2;
  undefined8 uVar14;
  ulong uVar15;
  iterator __begin1;
  long lVar16;
  byte bVar17;
  byte bVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  SharedVector<Point> *__range2;
  uint local_60 [2];
  float local_58;
  uint local_54;
  long *local_50;
  uint *local_48;
  uint local_40;
  uint local_3c;
  BoardView *local_38;
  
  local_60[0] = 0;
  local_54 = 0;
  local_38 = this;
  iVar12 = (*this->m_board->_vptr_Board[5])();
  local_50 = (long *)CONCAT44(extraout_var,iVar12);
  plVar13 = (long *)*local_50;
  plVar4 = (long *)local_50[1];
  if (plVar13 == plVar4) {
    iVar12 = 1;
  }
  else {
    fVar20 = 1.1754944e-38;
    do {
      local_58 = *(float *)(*plVar13 + 4);
      if (*(float *)(*plVar13 + 4) <= fVar20) {
        local_58 = fVar20;
      }
      plVar13 = plVar13 + 2;
      fVar20 = local_58;
    } while (plVar13 != plVar4);
    local_48 = local_60;
    uVar14 = CONCAT71((int7)((ulong)plVar4 >> 8),1);
    local_40 = 0;
    do {
      local_3c = (uint)uVar14;
      iVar12 = (*local_38->m_board->_vptr_Board[4])();
      plVar13 = *(long **)CONCAT44(extraout_var_00,iVar12);
      plVar4 = (long *)((long *)CONCAT44(extraout_var_00,iVar12))[1];
      if (plVar13 != plVar4) {
        lVar5 = *local_50;
        lVar16 = local_50[1] - lVar5 >> 4;
        do {
          if (lVar16 == 1) {
LAB_00112c3e:
            *local_48 = *local_48 + 1;
          }
          else {
            fVar20 = 0.0;
            bVar8 = true;
            bVar17 = 0;
            bVar18 = 0;
            uVar15 = 0;
            fVar21 = 0.0;
            do {
              pfVar6 = *(float **)(lVar5 + uVar15 * 0x10);
              pfVar7 = *(float **)(lVar5 + (uVar15 + 1) * 0x10);
              fVar22 = *pfVar6;
              fVar1 = *pfVar7;
              if ((((fVar22 != fVar1) || (NAN(fVar22) || NAN(fVar1))) || (pfVar6[1] != pfVar7[1]))
                 || (NAN(pfVar6[1]) || NAN(pfVar7[1]))) {
                bVar11 = false;
                bVar10 = false;
                fVar2 = pfVar7[1];
                bVar9 = !bVar8;
                bVar8 = bVar11;
                if (bVar9) {
                  if ((fVar20 == fVar1) && (!NAN(fVar20) && !NAN(fVar1))) {
                    bVar8 = bVar10;
                    if ((fVar21 == fVar2) &&
                       ((!NAN(fVar21) && !NAN(fVar2) && (uVar15 < lVar16 - 2U)))) {
                      pfVar7 = *(float **)(lVar5 + 0x20 + uVar15 * 0x10);
                      fVar20 = *pfVar7;
                      fVar21 = pfVar7[1];
                      bVar8 = true;
                      uVar15 = uVar15 + 1;
                    }
                  }
                }
                fVar3 = pfVar6[1];
                if (fVar3 <= fVar2) {
LAB_00112bd7:
                  if (fVar3 < fVar2) {
                    lVar19 = *plVar13;
                    fVar23 = *(float *)(lVar19 + 0x54);
                    if ((fVar3 < fVar23) && (fVar23 < fVar2)) goto LAB_00112bef;
                  }
                }
                else {
                  lVar19 = *plVar13;
                  fVar23 = *(float *)(lVar19 + 0x54);
                  if ((fVar3 <= fVar23) || (fVar23 <= fVar2)) goto LAB_00112bd7;
LAB_00112bef:
                  if ((fVar22 != fVar1) || (NAN(fVar22) || NAN(fVar1))) {
                    fVar22 = fVar22 + (fVar23 - fVar3) * ((fVar1 - fVar22) / (fVar2 - fVar3));
                  }
                  if (fVar22 <= *(float *)(lVar19 + 0x50)) {
                    if (fVar22 < *(float *)(lVar19 + 0x50)) {
                      bVar17 = bVar17 ^ 1;
                    }
                  }
                  else {
                    bVar18 = bVar18 ^ 1;
                  }
                }
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < lVar16 - 1U);
            if (!(bool)(bVar17 | bVar18)) goto LAB_00112c3e;
          }
          plVar13 = plVar13 + 2;
        } while (plVar13 != plVar4);
      }
      if (local_38->debug != false) {
        fprintf(_stderr,"EPC[%d]: %d\n",(ulong)local_40,(ulong)*local_48);
      }
      plVar4 = (long *)local_50[1];
      for (plVar13 = (long *)*local_50; plVar13 != plVar4; plVar13 = plVar13 + 2) {
        *(float *)(*plVar13 + 4) = local_58 - *(float *)(*plVar13 + 4);
      }
      local_40 = 1;
      local_48 = &local_54;
      uVar14 = 0;
    } while ((local_3c & 1) != 0);
    iVar12 = 0;
    if ((int)local_54 < (int)local_60[0] && (local_60[0] != 0 || local_54 != 0)) {
      plVar13 = (long *)local_50[1];
      for (local_50 = (long *)*local_50; iVar12 = 0, local_50 != plVar13; local_50 = local_50 + 2) {
        *(float *)(*local_50 + 4) = local_58 - *(float *)(*local_50 + 4);
      }
    }
  }
  return iVar12;
}

Assistant:

int BoardView::EPCCheck(void) {
	int epc[2] = {0, 0};
	int side;
	auto &outline = m_board->OutlinePoints();
	ImVec2 min, max;

	if (outline.empty()) {
		return 1;
	};

	// find the orthagonal bounding box
	// probably can put this as a predefined
	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;
	for (auto &p : outline) {
		if (p->x < min.x) min.x = p->x;
		if (p->y < min.y) min.y = p->y;
		if (p->x > max.x) max.x = p->x;
		if (p->y > max.y) max.y = p->y;
	}

	for (side = 0; side < 2; side++) {
		for (auto &p : m_board->Pins()) {
			// auto p = pin.get();
			int l, r;
			int jump = 1;
			Point fp;

			l = 0;
			r = 0;

			for (size_t i = 0; i < outline.size() - 1; i++) {
				Point &pa = *outline[i];
				Point &pb = *outline[i + 1];

				// jump double/dud points
				if (pa.x == pb.x && pa.y == pb.y) continue;

				// if we encounter our hull/poly start point, then we've now created the
				// closed
				// hull, jump the next segment and reset the first-point
				if ((!jump) && (fp.x == pb.x) && (fp.y == pb.y)) {
					if (i < outline.size() - 2) {
						fp   = *outline[i + 2];
						jump = 1;
						i++;
					}
				} else {
					jump = 0;
				}

				// test to see if this segment makes the scan-cut.
				if ((pa.y > pb.y && p->position.y < pa.y && p->position.y > pb.y) ||
				    (pa.y < pb.y && p->position.y > pa.y && p->position.y < pb.y)) {
					ImVec2 intersect;

					intersect.y = p->position.y;
					if (pa.x == pb.x)
						intersect.x = pa.x;
					else
						intersect.x = (pb.x - pa.x) / (pb.y - pa.y) * (p->position.y - pa.y) + pa.x;

					if (intersect.x > p->position.x)
						r++;
					else if (intersect.x < p->position.x)
						l++;
				}
			} // if we did get an intersection

			// If either side has no intersections, then it's out of bounds (likely)
			if ((l % 2 == 0) && (r % 2 == 0)) epc[side]++;
		} // pins

		if (debug) fprintf(stderr, "EPC[%d]: %d\n", side, epc[side]);

		// flip the outline
		for (auto &p : outline) p->y = max.y - p->y;

	} // side

	if ((epc[0] || epc[1]) && (epc[0] > epc[1])) {
		for (auto &p : outline) p->y = max.y - p->y;
	}

	return 0;
}